

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::HlslParseContext::addGenMulArgumentConversion
          (HlslParseContext *this,TSourceLoc *loc,TFunction *call,TIntermTyped **args)

{
  TStorageQualifier TVar1;
  uint uVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar3;
  int iVar4;
  int mr;
  undefined4 extraout_var;
  long lVar6;
  TIntermTyped *node;
  TIntermTyped *node_00;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  TBasicType local_d8;
  int local_cc;
  TType truncType;
  long *plVar5;
  
  if (*args == (TIntermTyped *)0x0) {
LAB_0038d726:
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    (*UNRECOVERED_JUMPTABLE)(this,loc,"expected: mul arguments","","",UNRECOVERED_JUMPTABLE);
    return;
  }
  iVar3 = (*((*args)->super_TIntermNode)._vptr_TIntermNode[6])();
  plVar5 = (long *)CONCAT44(extraout_var,iVar3);
  if (plVar5 == (long *)0x0) goto LAB_0038d726;
  lVar6 = (**(code **)(*plVar5 + 400))(plVar5);
  if (*(long *)(lVar6 + 0x10) - *(long *)(lVar6 + 8) != 0x10) goto LAB_0038d726;
  lVar6 = (**(code **)(*plVar5 + 400))(plVar5);
  node = (TIntermTyped *)(**(code **)(*(long *)**(undefined8 **)(lVar6 + 8) + 0x18))();
  lVar6 = (**(code **)(*plVar5 + 400))(plVar5);
  node_00 = (TIntermTyped *)(**(code **)(**(long **)(*(long *)(lVar6 + 8) + 8) + 0x18))();
  iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x2b])(node);
  if ((char)iVar3 == '\0') {
LAB_0038d683:
    iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x2b])(node);
    if ((char)iVar3 == '\0') {
LAB_0038d75e:
      iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x29])(node);
      if ((char)iVar3 == '\0') {
LAB_0038d812:
        iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x29])(node);
        if ((char)iVar3 != '\0') {
          iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x29])(node_00);
          if ((char)iVar3 != '\0') {
            iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x28])(node);
            iVar4 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x27])(node_00);
            if (iVar4 < iVar3) {
              local_d8 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node);
              iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x21])(node);
              TVar1 = *(TStorageQualifier *)(CONCAT44(extraout_var_04,iVar3) + 8);
              iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x21])(node);
              uVar2 = *(uint *)(CONCAT44(extraout_var_05,iVar3) + 8);
              local_cc = (*(node->super_TIntermNode)._vptr_TIntermNode[0x27])(node);
              iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x27])(node_00);
              goto LAB_0038d8c1;
            }
            iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x28])(node);
            iVar4 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x27])(node_00);
            if (iVar3 < iVar4) {
              local_d8 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x20])(node_00);
              iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x21])(node_00);
              TVar1 = *(TStorageQualifier *)(CONCAT44(extraout_var_10,iVar3) + 8);
              iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x21])(node_00);
              uVar2 = *(uint *)(CONCAT44(extraout_var_11,iVar3) + 8);
              iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x28])(node);
              goto LAB_0038daa0;
            }
          }
        }
      }
      else {
        iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x2b])(node_00);
        if ((char)iVar3 == '\0') goto LAB_0038d812;
        iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x26])(node_00);
        iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x28])(node);
        if (iVar3 < iVar4) {
          local_d8 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node);
          iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x21])(node);
          TVar1 = *(TStorageQualifier *)(CONCAT44(extraout_var_02,iVar3) + 8);
          iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x21])(node);
          uVar2 = *(uint *)(CONCAT44(extraout_var_03,iVar3) + 8);
          local_cc = (*(node->super_TIntermNode)._vptr_TIntermNode[0x27])(node);
          iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x26])(node_00);
LAB_0038d8c1:
          iVar4 = 0;
          goto LAB_0038d972;
        }
        iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x26])(node_00);
        iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x28])(node);
        if (iVar3 <= iVar4) goto LAB_0038daeb;
        local_d8 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x20])(node_00);
        iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x21])(node_00);
        TVar1 = *(TStorageQualifier *)(CONCAT44(extraout_var_08,iVar3) + 8);
        iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x21])(node_00);
        uVar2 = *(uint *)(CONCAT44(extraout_var_09,iVar3) + 8);
        iVar4 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x28])(node);
        iVar3 = 0;
        mr = 0;
LAB_0038dacc:
        TType::TType(&truncType,local_d8,TVar1 & 0x7f,uVar2 >> 0x19 & 7,iVar4,iVar3,mr,false);
        node_00 = addConstructor(this,loc,node_00,&truncType);
      }
    }
    else {
      iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x29])(node_00);
      if ((char)iVar3 == '\0') goto LAB_0038d75e;
      iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x26])(node);
      iVar4 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x27])(node_00);
      if (iVar3 < iVar4) {
        local_d8 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x20])(node_00);
        iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x21])(node_00);
        TVar1 = *(TStorageQualifier *)(CONCAT44(extraout_var_00,iVar3) + 8);
        iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x21])(node_00);
        uVar2 = *(uint *)(CONCAT44(extraout_var_01,iVar3) + 8);
        iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x26])(node);
LAB_0038daa0:
        mr = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x28])(node_00);
        iVar4 = 0;
        goto LAB_0038dacc;
      }
      iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x26])(node);
      iVar4 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x27])(node_00);
      if (iVar3 <= iVar4) goto LAB_0038daeb;
      local_d8 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x20])(node);
      iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x21])(node);
      TVar1 = *(TStorageQualifier *)(CONCAT44(extraout_var_06,iVar3) + 8);
      iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x21])(node);
      uVar2 = *(uint *)(CONCAT44(extraout_var_07,iVar3) + 8);
      iVar4 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x27])(node_00);
      local_cc = 0;
      iVar3 = 0;
LAB_0038d972:
      TType::TType(&truncType,local_d8,TVar1 & 0x7f,uVar2 >> 0x19 & 7,iVar4,local_cc,iVar3,false);
      node = addConstructor(this,loc,node,&truncType);
    }
  }
  else {
    iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x2b])(node_00);
    if ((char)iVar3 == '\0') goto LAB_0038d683;
  }
LAB_0038daeb:
  lVar6 = (**(code **)(*plVar5 + 400))(plVar5);
  if (node == (TIntermTyped *)**(long **)(lVar6 + 8)) {
    lVar6 = (**(code **)(*plVar5 + 400))(plVar5);
    if (node_00 == *(TIntermTyped **)(*(long *)(lVar6 + 8) + 8)) goto LAB_0038db3a;
  }
  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2e])
            (this,loc,"mul() matrix size mismatch","","");
LAB_0038db3a:
  lVar6 = (**(code **)(*plVar5 + 400))(plVar5);
  **(undefined8 **)(lVar6 + 8) = node;
  lVar6 = (**(code **)(*plVar5 + 400))(plVar5);
  *(TIntermTyped **)(*(long *)(lVar6 + 8) + 8) = node_00;
  iVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1f])(node);
  iVar4 = (*(call->super_TSymbol)._vptr_TSymbol[0x27])(call,0);
  *(ulong *)(CONCAT44(extraout_var_13,iVar4) + 8) = CONCAT44(extraout_var_12,iVar3);
  iVar3 = (*(node_00->super_TIntermNode)._vptr_TIntermNode[0x1f])(node_00);
  iVar4 = (*(call->super_TSymbol)._vptr_TSymbol[0x27])(call,1);
  *(ulong *)(CONCAT44(extraout_var_15,iVar4) + 8) = CONCAT44(extraout_var_14,iVar3);
  return;
}

Assistant:

void HlslParseContext::addGenMulArgumentConversion(const TSourceLoc& loc, TFunction& call, TIntermTyped*& args)
{
    TIntermAggregate* argAggregate = args ? args->getAsAggregate() : nullptr;

    if (argAggregate == nullptr || argAggregate->getSequence().size() != 2) {
        // It really ought to have two arguments.
        error(loc, "expected: mul arguments", "", "");
        return;
    }

    TIntermTyped* arg0 = argAggregate->getSequence()[0]->getAsTyped();
    TIntermTyped* arg1 = argAggregate->getSequence()[1]->getAsTyped();

    if (arg0->isVector() && arg1->isVector()) {
        // For:
        //    vec * vec: it's handled during intrinsic selection, so while we could do it here,
        //               we can also ignore it, which is easier.
    } else if (arg0->isVector() && arg1->isMatrix()) {
        // vec * mat: we clamp the vec if the mat col is smaller, else clamp the mat col.
        if (arg0->getVectorSize() < arg1->getMatrixCols()) {
            // vec is smaller, so truncate larger mat dimension
            const TType truncType(arg1->getBasicType(), arg1->getQualifier().storage, arg1->getQualifier().precision,
                                  0, arg0->getVectorSize(), arg1->getMatrixRows());
            arg1 = addConstructor(loc, arg1, truncType);
        } else if (arg0->getVectorSize() > arg1->getMatrixCols()) {
            // vec is larger, so truncate vec to mat size
            const TType truncType(arg0->getBasicType(), arg0->getQualifier().storage, arg0->getQualifier().precision,
                                  arg1->getMatrixCols());
            arg0 = addConstructor(loc, arg0, truncType);
        }
    } else if (arg0->isMatrix() && arg1->isVector()) {
        // mat * vec: we clamp the vec if the mat col is smaller, else clamp the mat col.
        if (arg1->getVectorSize() < arg0->getMatrixRows()) {
            // vec is smaller, so truncate larger mat dimension
            const TType truncType(arg0->getBasicType(), arg0->getQualifier().storage, arg0->getQualifier().precision,
                                  0, arg0->getMatrixCols(), arg1->getVectorSize());
            arg0 = addConstructor(loc, arg0, truncType);
        } else if (arg1->getVectorSize() > arg0->getMatrixRows()) {
            // vec is larger, so truncate vec to mat size
            const TType truncType(arg1->getBasicType(), arg1->getQualifier().storage, arg1->getQualifier().precision,
                                  arg0->getMatrixRows());
            arg1 = addConstructor(loc, arg1, truncType);
        }
    } else if (arg0->isMatrix() && arg1->isMatrix()) {
        // mat * mat: we clamp the smaller inner dimension to match the other matrix size.
        // Remember, HLSL Mrc = GLSL/SPIRV Mcr.
        if (arg0->getMatrixRows() > arg1->getMatrixCols()) {
            const TType truncType(arg0->getBasicType(), arg0->getQualifier().storage, arg0->getQualifier().precision,
                                  0, arg0->getMatrixCols(), arg1->getMatrixCols());
            arg0 = addConstructor(loc, arg0, truncType);
        } else if (arg0->getMatrixRows() < arg1->getMatrixCols()) {
            const TType truncType(arg1->getBasicType(), arg1->getQualifier().storage, arg1->getQualifier().precision,
                                  0, arg0->getMatrixRows(), arg1->getMatrixRows());
            arg1 = addConstructor(loc, arg1, truncType);
        }
    } else {
        // It's something with scalars: we'll just leave it alone.  Function selection will handle it
        // downstream.
    }

    // Warn if we altered one of the arguments
    if (arg0 != argAggregate->getSequence()[0] || arg1 != argAggregate->getSequence()[1])
        warn(loc, "mul() matrix size mismatch", "", "");

    // Put arguments back.  (They might be unchanged, in which case this is harmless).
    argAggregate->getSequence()[0] = arg0;
    argAggregate->getSequence()[1] = arg1;

    call[0].type = &arg0->getWritableType();
    call[1].type = &arg1->getWritableType();
}